

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NavierStokesBase.cpp
# Opt level: O3

void __thiscall
NavierStokesBase::checkPoint(NavierStokesBase *this,string *dir,ostream *os,How how,bool dump_old)

{
  pointer pcVar1;
  void *__s;
  long lVar2;
  ostream *poVar3;
  value_type *__val;
  string TAFileName;
  ofstream TImeAverageFile;
  string local_248;
  long local_228;
  long local_220 [3];
  int aiStack_208 [54];
  ios_base local_130 [264];
  
  amrex::AmrLevel::checkPoint(&this->super_AmrLevel,dir,os,how,dump_old);
  if (0 < avg_interval) {
    __s = operator_new(0x200000);
    memset(__s,0,0x200000);
    if (*(int *)(amrex::ParallelContext::frames + 0xc) == 0) {
      std::ofstream::ofstream(&local_228);
      (**(code **)(local_220[0] + 0x18))((filebuf *)local_220,__s,0x200000);
      pcVar1 = (dir->_M_dataplus)._M_p;
      local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_248,pcVar1,pcVar1 + dir->_M_string_length);
      std::__cxx11::string::append((char *)&local_248);
      std::ofstream::open((char *)&local_228,(_Ios_Openmode)local_248._M_dataplus._M_p);
      lVar2 = *(long *)(local_228 + -0x18);
      if (*(int *)((long)aiStack_208 + lVar2) != 0) {
        amrex::FileOpenFailed(&local_248);
        lVar2 = *(long *)(local_228 + -0x18);
      }
      *(undefined8 *)((long)local_220 + lVar2) = 0x11;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_228,"Writing time_average to checkpoint\n",0x23);
      poVar3 = std::ostream::_M_insert<double>
                         (time_avg.super_vector<double,_std::allocator<double>_>.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[(this->super_AmrLevel).level]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
      poVar3 = std::ostream::_M_insert<double>
                         (time_avg_fluct.super_vector<double,_std::allocator<double>_>.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[(this->super_AmrLevel).level]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._M_dataplus._M_p != &local_248.field_2) {
        operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
      }
      local_228 = _VTT;
      *(undefined8 *)((long)local_220 + *(long *)(_VTT + -0x18) + -8) = __M_insert<void_const*>;
      std::filebuf::~filebuf((filebuf *)local_220);
      std::ios_base::~ios_base(local_130);
    }
    operator_delete(__s,0x200000);
  }
  return;
}

Assistant:

void
NavierStokesBase::checkPoint (const std::string& dir,
			      std::ostream&      os,
			      VisMF::How         how,
			      bool               dump_old)
{
    AmrLevel::checkPoint(dir, os, how, dump_old);

    if (avg_interval > 0)
    {
        VisMF::IO_Buffer io_buffer(VisMF::IO_Buffer_Size);

        if (ParallelDescriptor::IOProcessor())
        {
            std::ofstream TImeAverageFile;
            TImeAverageFile.rdbuf()->pubsetbuf(io_buffer.dataPtr(), io_buffer.size());
            std::string TAFileName(dir + "/TimeAverage");
            TImeAverageFile.open(TAFileName.c_str(), std::ofstream::out |
                                 std::ofstream::trunc |
                                 std::ofstream::binary);

            if( !TImeAverageFile.good()) {
                amrex::FileOpenFailed(TAFileName);
            }

            TImeAverageFile.precision(17);

            // write out title line
            TImeAverageFile << "Writing time_average to checkpoint\n";

            TImeAverageFile << NavierStokesBase::time_avg[level] << "\n";
            TImeAverageFile << NavierStokesBase::time_avg_fluct[level] << "\n";
        }
    }

#ifdef AMREX_PARTICLES
    if (level == 0)
    {
        if (NSPC != 0)
            NSPC->Checkpoint(dir,the_ns_particle_file_name);
    }
#endif
}